

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessBorderAgent
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  int iVar3;
  char *pcVar4;
  Value *pVVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  _Alloc_hider _Var7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  uint64_t timeout;
  string netIf;
  CommissionerAppPtr commissioner;
  string local_278;
  format_string_checker<char> local_258;
  string *local_220;
  string *local_218;
  undefined1 local_210 [8];
  _Alloc_hider local_208;
  undefined1 local_200 [8];
  char local_1f8 [16];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  CommissionerAppPtr local_1c8;
  ErrorCode local_1b8;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  ErrorCode local_190;
  undefined1 *local_188;
  long local_180;
  undefined1 local_178 [16];
  ErrorCode local_168;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150 [16];
  ErrorCode local_140;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  BorderAgentHandler local_118;
  ErrorCode local_f0 [2];
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  Error local_c8;
  Error local_a0;
  Error local_78;
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_220 = (string *)&(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  local_218 = (string *)&__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
    local_258.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too few arguments";
    local_258.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
    local_258.context_.super_basic_format_parse_context<char>._16_8_ = 0;
    local_258.parse_funcs_[0] = (parse_func)0x0;
    pcVar8 = "too few arguments";
    local_258.context_.types_ = local_258.types_;
    do {
      pcVar4 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",&local_258);
      }
      pcVar8 = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_258;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_278,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_140 = kInvalidArgs;
    local_138 = local_128;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    local_210._0_4_ = local_140;
    local_208._M_p = local_1f8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_208,local_138,local_138 + local_130);
    local_1e0 = 0;
    local_1d8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_210._0_4_;
    local_1e8._M_p = (pointer)&local_1d8;
    std::__cxx11::string::operator=(local_220,(string *)&local_208);
    std::__cxx11::string::operator=(local_218,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p);
    }
    if (local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    if (local_138 != local_128) {
      operator_delete(local_138);
    }
    paVar6 = &local_278.field_2;
    _Var7._M_p = local_278._M_dataplus._M_p;
    goto LAB_00242b1f;
  }
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"discover","");
  utils::ToLower((string *)local_210,pbVar2 + 1);
  utils::ToLower((string *)&local_258,&local_278);
  if (local_208._M_p == local_258.context_.super_basic_format_parse_context<char>.format_str_.data_)
  {
    if (local_208._M_p == (char *)0x0) {
      bVar9 = true;
    }
    else {
      iVar3 = bcmp((void *)CONCAT44(local_210._4_4_,local_210._0_4_),(void *)local_258._0_8_,
                   (size_t)local_208._M_p);
      bVar9 = iVar3 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  if ((size_t *)local_258._0_8_ !=
      &local_258.context_.super_basic_format_parse_context<char>.format_str_.size_) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_200) {
    operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if (!bVar9) {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"get","");
    utils::ToLower((string *)local_210,pbVar2 + 1);
    utils::ToLower((string *)&local_258,&local_278);
    if (local_208._M_p ==
        local_258.context_.super_basic_format_parse_context<char>.format_str_.data_) {
      if (local_208._M_p == (char *)0x0) {
        bVar9 = true;
      }
      else {
        iVar3 = bcmp((void *)CONCAT44(local_210._4_4_,local_210._0_4_),(void *)local_258._0_8_,
                     (size_t)local_208._M_p);
        bVar9 = iVar3 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if ((size_t *)local_258._0_8_ !=
        &local_258.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      operator_delete((void *)local_258._0_8_);
    }
    if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_200) {
      operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if (bVar9) {
      local_1c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_1c8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      JobManager::GetSelectedCommissioner
                (&local_c8,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&local_1c8);
      local_210._0_4_ = local_c8.mCode;
      local_208._M_p = local_1f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_208,local_c8.mMessage._M_dataplus._M_p,
                 local_c8.mMessage._M_dataplus._M_p + local_c8.mMessage._M_string_length);
      local_1e0 = 0;
      local_1d8._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_210._0_4_;
      local_1e8._M_p = (pointer)&local_1d8;
      std::__cxx11::string::operator=(local_220,(string *)&local_208);
      std::__cxx11::string::operator=(local_218,(string *)&local_1e8);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_p != &local_1d8) {
        operator_delete(local_1e8._M_p);
      }
      if (local_208._M_p != local_1f8) {
        operator_delete(local_208._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.mMessage._M_dataplus._M_p != &local_c8.mMessage.field_2) {
        operator_delete(local_c8.mMessage._M_dataplus._M_p);
      }
      if (EVar1 == kNone) {
        pbVar2 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
          local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
          local_258.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "too few arguments";
          local_258.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
          local_258.context_.super_basic_format_parse_context<char>._16_8_ = 0;
          local_258.parse_funcs_[0] = (parse_func)0x0;
          pcVar8 = "too few arguments";
          local_258.context_.types_ = (type *)&local_258;
          do {
            pcVar4 = pcVar8 + 1;
            if (*pcVar8 == '}') {
              if ((pcVar4 == "") || (*pcVar4 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar4 = pcVar8 + 2;
            }
            else if (*pcVar8 == '{') {
              pcVar4 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                 (pcVar8,"",&local_258);
            }
            pcVar8 = pcVar4;
          } while (pcVar4 != "");
          args_01.field_1.args_ = in_R9.args_;
          args_01.desc_ = (unsigned_long_long)&local_258;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_278,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
          local_168 = kInvalidArgs;
          local_160 = local_150;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_278._M_dataplus._M_p,
                     local_278._M_dataplus._M_p + local_278._M_string_length);
          local_210._0_4_ = local_168;
          local_208._M_p = local_1f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,local_160,local_160 + local_158);
          local_1e0 = 0;
          local_1d8._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_210._0_4_;
          local_1e8._M_p = (pointer)&local_1d8;
          std::__cxx11::string::operator=(local_220,(string *)&local_208);
          std::__cxx11::string::operator=(local_218,(string *)&local_1e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_p != &local_1d8) {
            operator_delete(local_1e8._M_p);
          }
          if (local_208._M_p != local_1f8) {
            operator_delete(local_208._M_p);
          }
          if (local_160 != local_150) {
            operator_delete(local_160);
          }
          paVar6 = &local_278.field_2;
          local_50._M_dataplus._M_p = local_278._M_dataplus._M_p;
        }
        else {
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"locator","");
          utils::ToLower((string *)local_210,pbVar2 + 2);
          utils::ToLower((string *)&local_258,&local_278);
          if (local_208._M_p ==
              local_258.context_.super_basic_format_parse_context<char>.format_str_.data_) {
            if (local_208._M_p == (char *)0x0) {
              bVar9 = true;
            }
            else {
              iVar3 = bcmp((void *)CONCAT44(local_210._4_4_,local_210._0_4_),(void *)local_258._0_8_
                           ,(size_t)local_208._M_p);
              bVar9 = iVar3 == 0;
            }
          }
          else {
            bVar9 = false;
          }
          if ((size_t *)local_258._0_8_ !=
              &local_258.context_.super_basic_format_parse_context<char>.format_str_.size_) {
            operator_delete((void *)local_258._0_8_);
          }
          if ((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_) != local_200) {
            operator_delete((undefined1 *)CONCAT44(local_210._4_4_,local_210._0_4_));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p);
          }
          if (bVar9) {
            (*((local_1c8.
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x13])
                      (local_f0,local_1c8.
                                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,&local_258);
            local_210._0_4_ = local_f0[0];
            local_208._M_p = local_1f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,local_e8,local_e8 + local_e0);
            local_1e8._M_p = (pointer)&local_1d8;
            local_1e0 = 0;
            local_1d8._M_local_buf[0] = '\0';
            pVVar5 = Value::operator=(__return_storage_ptr__,(Value *)local_210);
            EVar1 = (pVVar5->mError).mCode;
            Value::~Value((Value *)local_210);
            if (local_e8 != local_d8) {
              operator_delete(local_e8);
            }
            if (EVar1 != kNone) goto LAB_00242eb6;
            ToHex<unsigned_short>(&local_50,(undefined2)local_258.types_[0]);
            Value::Value((Value *)local_210,&local_50);
            Value::operator=(__return_storage_ptr__,(Value *)local_210);
            Value::~Value((Value *)local_210);
            paVar6 = &local_50.field_2;
          }
          else {
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            pbVar2 = (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_278._M_dataplus._M_p = pbVar2[2]._M_dataplus._M_p;
            local_278._M_string_length = pbVar2[2]._M_string_length;
            fmt_00.size_ = 0xd;
            fmt_00.data_ = (char *)0x24;
            args_02.field_1.args_ = in_R9.args_;
            args_02.desc_ = (unsigned_long_long)&local_278;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_258,(v10 *)"{} is not a valid border agent field",fmt_00,
                       args_02);
            local_190 = kInvalidArgs;
            local_188 = local_178;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_188,local_258._0_8_,
                       local_258.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                       local_258._0_8_);
            local_210._0_4_ = local_190;
            local_208._M_p = local_1f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,local_188,local_188 + local_180);
            local_1e8._M_p = (pointer)&local_1d8;
            local_1e0 = 0;
            local_1d8._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_210);
            Value::~Value((Value *)local_210);
            if (local_188 != local_178) {
              operator_delete(local_188);
            }
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_258.context_.super_basic_format_parse_context<char>.format_str_.size_
            ;
            local_50._M_dataplus._M_p = (pointer)local_258._0_8_;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar6) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
LAB_00242eb6:
      if (local_1c8.
          super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return __return_storage_ptr__;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return __return_storage_ptr__;
    }
    local_258.types_[0] = 0xd;
    local_258.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "\'{}\' is not a valid sub-command";
    local_258.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
    local_258.context_.super_basic_format_parse_context<char>._16_8_ = 0x100000000;
    local_258.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar8 = "\'{}\' is not a valid sub-command";
    local_258.context_.types_ = (type *)&local_258;
    do {
      pcVar4 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar8,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_258);
      }
      pcVar8 = pcVar4;
    } while (pcVar4 != "");
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_258._0_8_ = pbVar2[1]._M_dataplus._M_p;
    local_258.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)pbVar2[1]._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1f;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_258;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_278,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
    local_1b8 = kInvalidCommand;
    local_1b0 = local_1a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_278._M_dataplus._M_p,
               local_278._M_dataplus._M_p + local_278._M_string_length);
    local_210._0_4_ = local_1b8;
    local_208._M_p = local_1f8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_208,local_1b0,local_1b0 + local_1a8);
    local_1e0 = 0;
    local_1d8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_210._0_4_;
    local_1e8._M_p = (pointer)&local_1d8;
    std::__cxx11::string::operator=(local_220,(string *)&local_208);
    std::__cxx11::string::operator=(local_218,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p);
    }
    if (local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0);
    }
    paVar6 = &local_278.field_2;
    _Var7._M_p = local_278._M_dataplus._M_p;
    goto LAB_00242b1f;
  }
  local_278._M_dataplus._M_p = (pointer)0xfa0;
  local_258._0_8_ = &local_258.context_.super_basic_format_parse_context<char>.format_str_.size_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
LAB_0024263e:
    if ((long)(aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x80) {
      std::__cxx11::string::_M_assign((string *)&local_258);
    }
    local_118.super__Function_base._M_functor._8_8_ = 0;
    local_118.super__Function_base._M_functor._M_unused._M_object = BorderAgentHandler;
    local_118._M_invoker =
         std::
         _Function_handler<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&),_void_(*)(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
         ::_M_invoke;
    local_118.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&),_void_(*)(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
         ::_M_manager;
    DiscoverBorderAgent(&local_a0,&local_118,(size_t)local_278._M_dataplus._M_p,(string *)&local_258
                       );
    local_210._0_4_ = local_a0.mCode;
    local_208._M_p = local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_a0.mMessage._M_dataplus._M_p,
               local_a0.mMessage._M_dataplus._M_p + local_a0.mMessage._M_string_length);
    local_1e0 = 0;
    local_1d8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_210._0_4_;
    local_1e8._M_p = (pointer)&local_1d8;
    std::__cxx11::string::operator=(local_220,(string *)&local_208);
    std::__cxx11::string::operator=(local_218,(string *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p);
    }
    if (local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.mMessage._M_dataplus._M_p != &local_a0.mMessage.field_2) {
      operator_delete(local_a0.mMessage._M_dataplus._M_p);
    }
    if (local_118.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_118.super__Function_base._M_manager)
                ((_Any_data *)&local_118,(_Any_data *)&local_118,__destroy_functor);
    }
  }
  else {
    utils::ParseInteger<unsigned_long>(&local_78,(unsigned_long *)&local_278,pbVar2 + 2);
    local_210._0_4_ = local_78.mCode;
    local_208._M_p = local_1f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_208,local_78.mMessage._M_dataplus._M_p,
               local_78.mMessage._M_dataplus._M_p + local_78.mMessage._M_string_length);
    local_1e0 = 0;
    local_1d8._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_210._0_4_;
    local_1e8._M_p = (pointer)&local_1d8;
    std::__cxx11::string::operator=(local_220,(string *)&local_208);
    std::__cxx11::string::operator=(local_218,(string *)&local_1e8);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_p != &local_1d8) {
      operator_delete(local_1e8._M_p);
    }
    if (local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.mMessage._M_dataplus._M_p != &local_78.mMessage.field_2) {
      operator_delete(local_78.mMessage._M_dataplus._M_p);
    }
    if (EVar1 == kNone) goto LAB_0024263e;
  }
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)&local_258.context_.super_basic_format_parse_context<char>.format_str_.size_;
  _Var7._M_p = (pointer)local_258._0_8_;
LAB_00242b1f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var7._M_p != paVar6) {
    operator_delete(_Var7._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBorderAgent(const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "discover"))
    {
        uint64_t    timeout = 4000;
        std::string netIf   = "";

        if (aExpr.size() >= 3)
        {
            SuccessOrExit(value = ParseInteger(timeout, aExpr[2]));
        }

        if (aExpr.size() == 4)
        {
            netIf = aExpr[3];
        }

        SuccessOrExit(value = DiscoverBorderAgent(BorderAgentHandler, static_cast<size_t>(timeout), netIf));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        CommissionerAppPtr commissioner = nullptr;

        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

        if (CaseInsensitiveEqual(aExpr[2], "locator"))
        {
            uint16_t locator;
            SuccessOrExit(value = commissioner->GetBorderAgentLocator(locator));
            value = ToHex(locator);
        }
        else
        {
            value = ERROR_INVALID_ARGS("{} is not a valid border agent field", aExpr[2]);
        }
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}